

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O0

void udbg_writeIcuInfo(FILE *out)

{
  char *pcVar1;
  UBool UVar2;
  char *pcVar3;
  UErrorCode local_7f8;
  int32_t local_7f4;
  UErrorCode status2;
  int32_t i;
  char *paramName;
  char str [2000];
  FILE *out_local;
  
  fprintf((FILE *)out," <icuSystemParams type=\"icu4c\">\n");
  local_7f4 = 0;
  while( true ) {
    _status2 = udbg_getSystemParameterNameByIndex(local_7f4);
    if (_status2 == (char *)0x0) break;
    local_7f8 = U_ZERO_ERROR;
    udbg_getSystemParameterValueByIndex(local_7f4,(char *)&paramName,2000,&local_7f8);
    UVar2 = U_SUCCESS(local_7f8);
    pcVar1 = _status2;
    if (UVar2 == '\0') {
      pcVar3 = u_errorName_63(local_7f8);
      fprintf((FILE *)out,"  <!-- n=\"%s\" ERROR: %s -->\n",pcVar1,pcVar3);
    }
    else {
      fprintf((FILE *)out,"    <param name=\"%s\">%s</param>\n",_status2,&paramName);
    }
    local_7f4 = local_7f4 + 1;
  }
  fprintf((FILE *)out," </icuSystemParams>\n");
  return;
}

Assistant:

U_CAPI void udbg_writeIcuInfo(FILE *out) {
  char str[2000];
  /* todo: API for writing DTD? */
  fprintf(out, " <icuSystemParams type=\"icu4c\">\n");
  const char *paramName;
  for(int32_t i=0;(paramName=udbg_getSystemParameterNameByIndex(i))!=NULL;i++) {
    UErrorCode status2 = U_ZERO_ERROR;
    udbg_getSystemParameterValueByIndex(i, str,2000,&status2);
    if(U_SUCCESS(status2)) {
      fprintf(out,"    <param name=\"%s\">%s</param>\n", paramName,str);
    } else {
      fprintf(out,"  <!-- n=\"%s\" ERROR: %s -->\n", paramName, u_errorName(status2));
    }
  }
  fprintf(out, " </icuSystemParams>\n");
}